

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O3

Point __thiscall cppurses::Text_display::display_position(Text_display *this,size_t index)

{
  pointer pLVar1;
  pointer pLVar2;
  ulong uVar3;
  pointer pGVar4;
  pointer pGVar5;
  size_t sVar6;
  size_t sVar7;
  Line_info *info;
  pointer pLVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  Point PVar13;
  
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar1 != pLVar2) {
    lVar10 = 0;
    pLVar8 = pLVar1;
    do {
      if (index < pLVar8->start_index) goto LAB_0014723a;
      lVar10 = lVar10 + 1;
      pLVar8 = pLVar8 + 1;
    } while (pLVar8 != pLVar2);
  }
  lVar10 = (long)pLVar2 - (long)pLVar1 >> 4;
LAB_0014723a:
  uVar11 = lVar10 - 1;
  uVar3 = this->top_line_;
  if (uVar11 < uVar3) {
    sVar6 = 0;
    sVar12 = 0;
  }
  else {
    sVar6 = display_height(this);
    uVar9 = (uVar3 + sVar6) - 1;
    if (uVar9 < uVar11) {
      pLVar1 = (this->display_state_).
               super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar9;
      if (sVar6 + uVar3 <
          (ulong)((long)(this->display_state_).
                        super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1 >> 4)) {
        sVar6 = pLVar1[sVar6 + uVar3].start_index;
      }
      else {
        pGVar4 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                 super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar5 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                 super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pGVar4 == pGVar5) {
          sVar6 = 0;
        }
        else {
          sVar6 = ((long)pGVar5 - (long)pGVar4 >> 3) * -0x5555555555555555 - 1;
        }
      }
    }
    else {
      sVar6 = ((long)(this->contents_).
                     super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                     super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->contents_).
                     super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                     super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (index <= sVar6) {
        sVar6 = index;
      }
    }
    sVar12 = uVar11 - this->top_line_;
    sVar7 = first_index_at(this,uVar11);
    sVar6 = sVar6 - sVar7;
  }
  PVar13.y = sVar12;
  PVar13.x = sVar6;
  return PVar13;
}

Assistant:

Point Text_display::display_position(std::size_t index) const {
    Point position;
    auto line = this->line_at(index);
    if (line < this->top_line()) {
        return position;
    }
    const auto last_shown_line = this->bottom_line();
    if (line > last_shown_line) {
        line = last_shown_line;
        index = this->last_index_at(line);
    } else if (index > this->contents().size()) {
        index = this->contents().size();
    }
    position.y = line - this->top_line();
    position.x = index - this->first_index_at(line);
    return position;
}